

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

char * qstrncpy(char *dst,char *src,size_t len)

{
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *local_20;
  
  if (((in_RDI != (char *)0x0) && (in_RDX != 0)) && (*in_RDI = '\0', in_RSI != (char *)0x0)) {
    strncat(in_RDI,in_RSI,in_RDX - 1);
  }
  local_20 = in_RDI;
  if (in_RSI == (char *)0x0) {
    local_20 = (char *)0x0;
  }
  return local_20;
}

Assistant:

char *qstrncpy(char *dst, const char *src, size_t len)
{
    if (dst && len > 0) {
        *dst = '\0';
        if (src)
            std::strncat(dst, src, len - 1);
    }
    return src ? dst : nullptr;
}